

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O0

bool __thiscall Func::CanOptimizeTryFinally(Func *this)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  JITTimeProfileInfo *this_00;
  byte local_25;
  byte local_11;
  Func *this_local;
  
  bVar1 = JITTimeWorkItem::IsLoopBody(this->m_workItem);
  local_11 = 0;
  if (!bVar1) {
    sourceContextId = GetSourceContextId(this);
    functionId = GetLocalFunctionId(this);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01eafdf0,OptimizeTryFinallyPhase,sourceContextId,functionId);
    local_11 = 0;
    if (!bVar1) {
      bVar1 = HasProfileInfo(this);
      local_25 = 1;
      if (bVar1) {
        this_00 = GetReadOnlyProfileInfo(this);
        bVar1 = JITTimeProfileInfo::IsOptimizeTryFinallyDisabled(this_00);
        local_25 = bVar1 ^ 0xff;
      }
      local_11 = local_25;
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool CanOptimizeTryFinally() const
    {
        return !this->m_workItem->IsLoopBody() && !PHASE_OFF(Js::OptimizeTryFinallyPhase, this) &&
            (!this->HasProfileInfo() || !this->GetReadOnlyProfileInfo()->IsOptimizeTryFinallyDisabled());
    }